

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Document::skip(Document *this)

{
  bool bVar1;
  Token *pTVar2;
  Node *pNVar3;
  Token local_40;
  
  if (*(char *)((long)(this->stream->scanner)._M_t.
                      super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                      .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false> + 0x4a) == '\0') {
    pNVar3 = this->Root;
    if (pNVar3 == (Node *)0x0) {
      getRoot(this);
      pNVar3 = this->Root;
    }
    (*pNVar3->_vptr_Node[1])();
    pTVar2 = peekNext(this);
    if (pTVar2->Kind != TK_StreamEnd) {
      if (pTVar2->Kind == TK_DocumentEnd) {
        getNext(&local_40,this);
        std::__cxx11::string::_M_dispose();
        bVar1 = skip(this);
        return bVar1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Document::skip()  {
  if (stream.scanner->failed())
    return false;
  if (!Root)
    getRoot();
  Root->skip();
  Token &T = peekNext();
  if (T.Kind == Token::TK_StreamEnd)
    return false;
  if (T.Kind == Token::TK_DocumentEnd) {
    getNext();
    return skip();
  }
  return true;
}